

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_create_index.cpp
# Opt level: O3

TableCatalogEntry * __thiscall
duckdb::LogicalCreateIndex::BindTable
          (LogicalCreateIndex *this,ClientContext *context,CreateIndexInfo *info_p)

{
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_10;
  
  local_10 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                       (context,&(info_p->super_CreateInfo).catalog,
                        &(info_p->super_CreateInfo).schema,&info_p->table,THROW_EXCEPTION,
                        (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_10);
  return local_10.ptr;
}

Assistant:

TableCatalogEntry &LogicalCreateIndex::BindTable(ClientContext &context, CreateIndexInfo &info_p) {
	auto &catalog = info_p.catalog;
	auto &schema = info_p.schema;
	auto &table_name = info_p.table;
	return Catalog::GetEntry<TableCatalogEntry>(context, catalog, schema, table_name);
}